

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::ReplaceStringInPlace
               (string *subject,char *search,int searchSize,char *replace,int replaceSize,
               size_t *firstReplacementIndex)

{
  ulong uVar1;
  undefined4 in_register_00000084;
  bool bVar2;
  
  strlen(search);
  bVar2 = false;
  uVar1 = std::__cxx11::string::find((char *)subject,(ulong)search,0);
  if (uVar1 != 0xffffffffffffffff) {
    bVar2 = false;
    do {
      strlen(replace);
      std::__cxx11::string::replace
                ((ulong)subject,uVar1,(char *)(ulong)(uint)searchSize,(ulong)replace);
      if (!bVar2) {
        *(ulong *)CONCAT44(in_register_00000084,replaceSize) = uVar1;
        bVar2 = true;
      }
      strlen(search);
      uVar1 = std::__cxx11::string::find((char *)subject,(ulong)search,uVar1 + 1);
    } while (uVar1 != 0xffffffffffffffff);
  }
  return bVar2;
}

Assistant:

static bool ReplaceStringInPlace(
    std::string& subject,
    const char* search,
    int searchSize,
    const char* replace,
    int replaceSize,
    std::size_t& firstReplacementIndex)
{
    bool changed{false};
    std::size_t pos{0};
    while ((pos = subject.find(search, pos)) != std::string::npos) {
        subject.replace(pos, searchSize, replace);
        if (!changed) {
            changed = true;
            firstReplacementIndex = pos;
        }
        pos += replaceSize;
    }
    return changed;
}